

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

ssize_t __thiscall MT32Emu::MemoryRegion::write(MemoryRegion *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  Bit8u BVar2;
  Bit32u BVar3;
  Bit8u *pBVar4;
  uint uVar5;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint in_R8D;
  ulong uVar10;
  byte in_R9B;
  ulong uVar6;
  
  BVar3 = this->entrySize;
  uVar5 = this->entries * BVar3;
  uVar6 = (ulong)uVar5;
  uVar8 = (uint)__buf;
  if ((uVar8 <= uVar5 - 1) && (pBVar4 = this->realMemory, pBVar4 != (Bit8u *)0x0)) {
    uVar9 = (ulong)(uVar5 - uVar8);
    if (in_R8D + uVar8 <= uVar5) {
      uVar9 = (ulong)in_R8D;
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      uVar1 = (BVar3 * __fd + uVar8) + uVar10;
      if (this->maxTable == (Bit8u *)0x0) {
        uVar7 = 0xff;
LAB_0015cd16:
        uVar6 = uVar7 & 0xff;
        if (*(byte *)(__n + uVar10) < (byte)uVar7) {
          uVar6 = (ulong)*(byte *)(__n + uVar10);
        }
        pBVar4[uVar1 & 0xffffffff] = (Bit8u)uVar6;
      }
      else {
        uVar6 = uVar1 & 0xffffffff;
        BVar2 = this->maxTable[uVar6 % (ulong)this->entrySize];
        uVar6 = CONCAT71((int7)(uVar6 / this->entrySize >> 8),BVar2);
        uVar7 = uVar6;
        if ((BVar2 == '\0' & (in_R9B ^ 1)) == 0) goto LAB_0015cd16;
      }
    }
  }
  return uVar6;
}

Assistant:

void MemoryRegion::write(unsigned int entry, unsigned int off, const Bit8u *src, unsigned int len, bool init) const {
	unsigned int memOff = entry * entrySize + off;
	// This method should never be called with out-of-bounds parameters,
	// or on an unsupported region - seeing any of this debug output indicates a bug in the emulator
	if (off > entrySize * entries - 1) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: parameters start out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}
	if (off + len > entrySize * entries) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: parameters end out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		len = entrySize * entries - off;
	}
	Bit8u *dest = getRealMemory();
	if (dest == NULL) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("write[%d]: unwritable region: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}

	for (unsigned int i = 0; i < len; i++) {
		Bit8u desiredValue = src[i];
		Bit8u maxValue = getMaxValue(memOff);
		// maxValue == 0 means write-protected unless called from initialisation code, in which case it really means the maximum value is 0.
		if (maxValue != 0 || init) {
			if (desiredValue > maxValue) {
#if MT32EMU_MONITOR_SYSEX > 0
				synth->printDebug("write[%d]: Wanted 0x%02x at %d, but max 0x%02x", type, desiredValue, memOff, maxValue);
#endif
				desiredValue = maxValue;
			}
			dest[memOff] = desiredValue;
		} else if (desiredValue != 0) {
#if MT32EMU_MONITOR_SYSEX > 0
			// Only output debug info if they wanted to write non-zero, since a lot of things cause this to spit out a lot of debug info otherwise.
			synth->printDebug("write[%d]: Wanted 0x%02x at %d, but write-protected", type, desiredValue, memOff);
#endif
		}
		memOff++;
	}
}